

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_PCR_SELECT_Unmarshal(TPMS_PCR_SELECT *target,BYTE **buffer,INT32 *size)

{
  BYTE *pBVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT8_Unmarshal(&target->sizeofSelect,buffer,size);
  if (((TVar2 == 0) && (TVar2 = 0x84, target->sizeofSelect == '\x03')) && (TVar2 = 0x9a, 2 < *size))
  {
    pBVar1 = *buffer;
    target->pcrSelect[2] = pBVar1[2];
    *(undefined2 *)target->pcrSelect = *(undefined2 *)pBVar1;
    *size = *size + -3;
    *buffer = *buffer + 3;
    TVar2 = 0;
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMS_PCR_SELECT_Unmarshal(TPMS_PCR_SELECT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT8_Unmarshal((UINT8 *)&(target->sizeofSelect), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( (target->sizeofSelect < PCR_SELECT_MIN))
        return TPM_RC_VALUE;
    if((target->sizeofSelect) > PCR_SELECT_MAX)
        return TPM_RC_VALUE;
    result = BYTE_Array_Unmarshal((BYTE *)(target->pcrSelect), buffer, size, (INT32)(target->sizeofSelect));
    return result;
}